

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

QTextLayoutStruct * __thiscall
QTextDocumentLayoutPrivate::layoutCell
          (QTextDocumentLayoutPrivate *this,QTextTable *t,QTextTableCell *cell,QFixed width,
          int layoutFrom,int layoutTo,QTextTableData *td,QFixed absoluteTableY,bool withPageBreaks)

{
  bool bVar1;
  QFixed QVar2;
  int iVar3;
  QFixed other;
  int iVar4;
  int iVar5;
  Position PVar6;
  const_reference pQVar7;
  QFixed *pQVar8;
  QTextTableCell *this_00;
  qsizetype qVar9;
  QTextFrameData *pQVar10;
  long lVar11;
  QFixed *pQVar12;
  QTextTable *in_RDX;
  QTextLayoutStruct *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  long in_stack_00000010;
  byte in_stack_00000020;
  QTextFrameData *cd_1;
  QTextFrame *frame_1;
  int i_1;
  QTextFrameData *cd;
  QTextFrame *frame;
  int i;
  qreal headerRowBottomBorderWidth;
  int headerRowCount;
  int currentPage;
  QTextLayoutStruct *layoutStruct;
  QFixed floatMinWidth;
  QList<QTextFrame_*> childFrames;
  QFixed pageTop;
  QFixed topPadding;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  int in_stack_000003c8;
  QFixed in_stack_000003cc;
  Iterator in_stack_00000520;
  QLoggingCategory *in_stack_fffffffffffffd48;
  QTextLayoutStruct *in_stack_fffffffffffffd50;
  QList<QPointer<QTextFrame>_> *this_01;
  QTextFormat *in_stack_fffffffffffffd58;
  QFixed *b;
  QTextTableData *in_stack_fffffffffffffd60;
  QTextFrame *this_02;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  QTextTableCell *in_stack_fffffffffffffd78;
  Edge in_stack_fffffffffffffd8c;
  QTextTableCell *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  int local_1f4;
  int local_1dc;
  QFixed local_184;
  int local_180;
  int local_17c;
  QList<QTextFrame_*> local_178;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  undefined4 local_134;
  undefined4 local_130;
  int local_12c;
  int local_128;
  int local_124;
  undefined4 local_120;
  undefined4 local_11c;
  int local_118;
  int local_114;
  int local_110;
  QFixed local_10c;
  QFixed local_108;
  QFixed local_104;
  QSizeF local_100;
  int local_f0;
  QFixed local_ec;
  int local_e8;
  int in_stack_ffffffffffffff1c;
  QFixed in_stack_ffffffffffffff20;
  QFixed in_stack_ffffffffffffff24;
  QFixed in_stack_ffffffffffffff2c;
  QFixed local_d0;
  QFixed local_cc [9];
  QDebug local_a8;
  int local_9c;
  QFixed *local_88;
  QList<QPointer<QTextFrame>_> *local_80;
  QFixed *local_78;
  QTextFrame *local_70;
  QTextTableCell local_68 [5];
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  local_9c = in_R8D;
  lcTable();
  anon_unknown.dwarf_13b8fb2::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd48);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_13b8fb2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x801cc3);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,
               (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),(char *)in_stack_fffffffffffffd48,
               (char *)0x801cdc);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffd68,
                       (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    QDebug::~QDebug(&local_a8);
    local_10 = 0;
  }
  memcpy(in_RDI,&DAT_00bd21e8,0x90);
  QTextLayoutStruct::QTextLayoutStruct(in_stack_fffffffffffffd50);
  in_RDI->frame = &in_RDX->super_QTextFrame;
  QFixed::QFixed(local_cc,0);
  (in_RDI->minimumWidth).val = local_cc[0].val;
  QFixed::QFixed(&local_d0,0x7fffff);
  (in_RDI->maximumWidth).val = local_d0.val;
  QFixed::QFixed((QFixed *)&stack0xffffffffffffff2c,0);
  (in_RDI->y).val = in_stack_ffffffffffffff2c.val;
  QVar2 = QTextTableData::topPadding
                    ((QTextTableData *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)
                     ,(QTextTable *)in_stack_fffffffffffffd68,
                     (QTextTableCell *)in_stack_fffffffffffffd60);
  if ((in_stack_00000020 & 1) != 0) {
    QTextTableCell::row((QTextTableCell *)in_stack_fffffffffffffd58);
    pQVar7 = QList<QFixed>::at((QList<QFixed> *)in_stack_fffffffffffffd50,
                               (qsizetype)in_stack_fffffffffffffd48);
    in_stack_ffffffffffffff1c = pQVar7->val;
    local_e8 = QVar2.val;
    in_stack_ffffffffffffff20 =
         QFixed::operator+((QFixed *)in_stack_fffffffffffffd48,(int)in_stack_fffffffffffffd50);
    QVar2.val = local_e8;
    in_stack_ffffffffffffff24 =
         QFixed::operator+((QFixed *)in_stack_fffffffffffffd48,(int)in_stack_fffffffffffffd50);
    (in_RDI->frameY).val = in_stack_ffffffffffffff24.val;
  }
  QFixed::QFixed(&local_ec,0);
  (in_RDI->x_left).val = local_ec.val;
  (in_RDI->x_right).val = local_9c;
  local_100 = QTextDocument::pageSize((QTextDocument *)in_stack_fffffffffffffd58);
  QSizeF::height(&local_100);
  local_f0 = (int)QFixed::fromReal((qreal)in_stack_fffffffffffffd48);
  (in_RDI->pageHeight).val = local_f0;
  local_104.val = (in_RDI->pageHeight).val;
  QFixed::QFixed(&local_108,0);
  bVar1 = ::operator<(local_104,local_108);
  if ((bVar1) || ((in_stack_00000020 & 1) == 0)) {
    QFixed::QFixed(&local_10c,0x7fffff);
    (in_RDI->pageHeight).val = local_10c.val;
  }
  QTextLayoutStruct::currentPage(in_stack_fffffffffffffd50);
  local_11c = *(undefined4 *)(in_stack_00000010 + 0x78);
  local_118 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffd48,
                                     (QFixed)(int)in_stack_fffffffffffffd50);
  local_120 = *(undefined4 *)(in_stack_00000010 + 0x28);
  local_114 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffd48,
                                     (QFixed)(int)in_stack_fffffffffffffd50);
  QTextTableCell::format(in_stack_fffffffffffffd78);
  QTextTableData::paddingProperty
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (Property)((ulong)in_stack_fffffffffffffd50 >> 0x20));
  local_110 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffd48,
                                     (QFixed)(int)in_stack_fffffffffffffd50);
  (in_RDI->pageTopMargin).val = local_110;
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x802066);
  QTextTable::format((QTextTable *)in_stack_fffffffffffffd60);
  iVar3 = QTextTableFormat::headerRowCount((QTextTableFormat *)0x802088);
  QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x80209c);
  if (((*(byte *)(in_stack_00000010 + 0x148) & 1) != 0) && (0 < iVar3)) {
    QTextTableCell::column((QTextTableCell *)in_stack_fffffffffffffd58);
    QTextTable::cellAt((QTextTable *)in_stack_fffffffffffffd68,
                       (int)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                       (int)in_stack_fffffffffffffd60);
    axisEdgeData(in_RDX,(QTextTableData *)
                        CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
    EdgeData::~EdgeData((EdgeData *)0x802168);
    QTextTableCell::~QTextTableCell(local_68);
    scaleToDevice(in_stack_fffffffffffffd68,(qreal)in_stack_fffffffffffffd60);
    other = QFixed::fromReal((qreal)in_stack_fffffffffffffd48);
    QFixed::operator+=(&in_RDI->pageTopMargin,other);
  }
  local_130 = *(undefined4 *)(in_stack_00000010 + 0x78);
  local_12c = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffd48,
                                     (QFixed)(int)in_stack_fffffffffffffd50);
  local_134 = *(undefined4 *)(in_stack_00000010 + 0x13c);
  local_128 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffd48,
                                     (QFixed)(int)in_stack_fffffffffffffd50);
  QTextTableData::bottomPadding
            ((QTextTableData *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (QTextTable *)in_stack_fffffffffffffd68,(QTextTableCell *)in_stack_fffffffffffffd60);
  local_124 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffd48,
                                     (QFixed)(int)in_stack_fffffffffffffd50);
  (in_RDI->pageBottomMargin).val = local_124;
  local_140 = (in_RDI->pageHeight).val;
  local_13c = (int)::operator*(0,(QFixed)(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  local_144 = (in_RDI->pageBottomMargin).val;
  local_138 = (int)QFixed::operator-((QFixed *)in_stack_fffffffffffffd48,
                                     (QFixed)(int)in_stack_fffffffffffffd50);
  (in_RDI->pageBottom).val = local_138;
  in_RDI->fullLayout = true;
  local_148 = 0xaaaaaaaa;
  local_154 = (in_RDI->pageHeight).val;
  local_150 = (int)::operator*(0,(QFixed)(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  local_158 = (in_RDI->pageTopMargin).val;
  local_14c = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffd48,
                                     (QFixed)(int)in_stack_fffffffffffffd50);
  local_15c = (in_RDI->frameY).val;
  local_148 = (int)QFixed::operator-((QFixed *)in_stack_fffffffffffffd48,
                                     (QFixed)(int)in_stack_fffffffffffffd50);
  pQVar8 = qMax<QFixed>((QFixed *)in_stack_fffffffffffffd60,(QFixed *)in_stack_fffffffffffffd58);
  (in_RDI->y).val = pQVar8->val;
  local_178.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_178.d.ptr = (QTextFrame **)&DAT_aaaaaaaaaaaaaaaa;
  local_178.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  iVar3 = QTextTableCell::row((QTextTableCell *)in_stack_fffffffffffffd58);
  iVar4 = QTextTableCell::column((QTextTableCell *)in_stack_fffffffffffffd58);
  iVar5 = QTextTable::rows((QTextTable *)in_stack_fffffffffffffd50);
  local_17c = iVar3 + iVar4 * iVar5;
  QMultiHash<int,_QTextFrame_*>::values
            ((QMultiHash<int,_QTextFrame_*> *)in_stack_fffffffffffffd58,
             (int *)in_stack_fffffffffffffd50);
  local_1dc = 0;
  while( true ) {
    this_00 = (QTextTableCell *)(long)local_1dc;
    qVar9 = QList<QTextFrame_*>::size(&local_178);
    if (qVar9 <= (long)this_00) break;
    QList<QTextFrame_*>::at
              ((QList<QTextFrame_*> *)in_stack_fffffffffffffd50,(qsizetype)in_stack_fffffffffffffd48
              );
    pQVar10 = ::data((QTextFrame *)in_stack_fffffffffffffd50);
    pQVar10->sizeDirty = true;
    local_1dc = local_1dc + 1;
  }
  QTextTableCell::begin(this_00);
  local_180 = local_9c;
  layoutFlow((QTextDocumentLayoutPrivate *)CONCAT44(in_stack_ffffffffffffff2c.val,QVar2.val),
             in_stack_00000520,
             (QTextLayoutStruct *)
             CONCAT44(in_stack_ffffffffffffff24.val,in_stack_ffffffffffffff20.val),in_stack_000003c8
             ,in_stack_ffffffffffffff1c,in_stack_000003cc);
  local_184.val = -0x55555556;
  QFixed::QFixed(&local_184);
  local_1f4 = 0;
  pQVar8 = local_88;
  this_01 = local_80;
  b = local_78;
  this_02 = local_70;
  while( true ) {
    lVar11 = (long)local_1f4;
    qVar9 = QList<QTextFrame_*>::size(&local_178);
    if (qVar9 <= lVar11) break;
    QList<QTextFrame_*>::at((QList<QTextFrame_*> *)this_01,(qsizetype)pQVar8);
    ::data((QTextFrame *)this_01);
    QTextFrame::frameFormat(this_02);
    PVar6 = QTextFrameFormat::position((QTextFrameFormat *)0x8025e8);
    QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x8025f9);
    if (PVar6 != InFlow) {
      QFixed::operator+(pQVar8,(QFixed)(int)this_01);
      pQVar12 = qMax<QFixed>((QFixed *)this_02,b);
      (in_RDI->y).val = pQVar12->val;
    }
    pQVar12 = qMax<QFixed>((QFixed *)this_02,b);
    local_184.val = pQVar12->val;
    local_1f4 = local_1f4 + 1;
  }
  pQVar8 = qMax<QFixed>((QFixed *)this_02,b);
  (in_RDI->maximumWidth).val = pQVar8->val;
  pQVar8 = qMax<QFixed>((QFixed *)this_02,b);
  (in_RDI->minimumWidth).val = pQVar8->val;
  ::data((QTextFrame *)this_01);
  QList<QPointer<QTextFrame>_>::clear(this_01);
  QList<QTextFrame_*>::~QList((QList<QTextFrame_*> *)0x802717);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QTextLayoutStruct QTextDocumentLayoutPrivate::layoutCell(QTextTable *t, const QTextTableCell &cell, QFixed width,
                                                        int layoutFrom, int layoutTo, QTextTableData *td,
                                                        QFixed absoluteTableY, bool withPageBreaks)
{
    qCDebug(lcTable) << "layoutCell";
    QTextLayoutStruct layoutStruct;
    layoutStruct.frame = t;
    layoutStruct.minimumWidth = 0;
    layoutStruct.maximumWidth = QFIXED_MAX;
    layoutStruct.y = 0;

    const QFixed topPadding = td->topPadding(t, cell);
    if (withPageBreaks) {
        layoutStruct.frameY = absoluteTableY + td->rowPositions.at(cell.row()) + topPadding;
    }
    layoutStruct.x_left = 0;
    layoutStruct.x_right = width;
    // we get called with different widths all the time (for example for figuring
    // out the min/max widths), so we always have to do the full layout ;(
    // also when for example in a table layoutFrom/layoutTo affect only one cell,
    // making that one cell grow the available width of the other cells may change
    // (shrink) and therefore when layoutCell gets called for them they have to
    // be re-laid out, even if layoutFrom/layoutTo is not in their range. Hence
    // this line:

    layoutStruct.pageHeight = QFixed::fromReal(document->pageSize().height());
    if (layoutStruct.pageHeight < 0 || !withPageBreaks)
        layoutStruct.pageHeight = QFIXED_MAX;
    const int currentPage = layoutStruct.currentPage();

    layoutStruct.pageTopMargin = td->effectiveTopMargin
            + td->cellSpacing
            + td->border
            + td->paddingProperty(cell.format(), QTextFormat::TableCellTopPadding); // top cell-border is not repeated

#ifndef QT_NO_CSSPARSER
    const int headerRowCount = t->format().headerRowCount();
    if (td->borderCollapse && headerRowCount > 0) {
        // consider the header row's bottom edge width
        qreal headerRowBottomBorderWidth = axisEdgeData(t, td, t->cellAt(headerRowCount - 1, cell.column()), QCss::BottomEdge).width;
        layoutStruct.pageTopMargin += QFixed::fromReal(scaleToDevice(headerRowBottomBorderWidth) / 2);
    }
#endif

    layoutStruct.pageBottomMargin = td->effectiveBottomMargin + td->cellSpacing + td->effectiveBottomBorder + td->bottomPadding(t, cell);
    layoutStruct.pageBottom = (currentPage + 1) * layoutStruct.pageHeight - layoutStruct.pageBottomMargin;

    layoutStruct.fullLayout = true;

    QFixed pageTop = currentPage * layoutStruct.pageHeight + layoutStruct.pageTopMargin - layoutStruct.frameY;
    layoutStruct.y = qMax(layoutStruct.y, pageTop);

    const QList<QTextFrame *> childFrames = td->childFrameMap.values(cell.row() + cell.column() * t->rows());
    for (int i = 0; i < childFrames.size(); ++i) {
        QTextFrame *frame = childFrames.at(i);
        QTextFrameData *cd = data(frame);
        cd->sizeDirty = true;
    }

    layoutFlow(cell.begin(), &layoutStruct, layoutFrom, layoutTo, width);

    QFixed floatMinWidth;

    // floats that are located inside the text (like inline images) aren't taken into account by
    // layoutFlow with regards to the cell height (layoutStruct->y), so for a safety measure we
    // do that here. For example with <td><img align="right" src="..." />blah</td>
    // when the image happens to be higher than the text
    for (int i = 0; i < childFrames.size(); ++i) {
        QTextFrame *frame = childFrames.at(i);
        QTextFrameData *cd = data(frame);

        if (frame->frameFormat().position() != QTextFrameFormat::InFlow)
            layoutStruct.y = qMax(layoutStruct.y, cd->position.y + cd->size.height);

        floatMinWidth = qMax(floatMinWidth, cd->minimumWidth);
    }

    // constraint the maximum/minimumWidth by the minimum width of the fixed size floats,
    // to keep them visible
    layoutStruct.maximumWidth = qMax(layoutStruct.maximumWidth, floatMinWidth);
    layoutStruct.minimumWidth = qMax(layoutStruct.minimumWidth, floatMinWidth);

    // as floats in cells get added to the table's float list but must not affect
    // floats in other cells we must clear the list here.
    data(t)->floats.clear();

//    qDebug("layoutCell done");

    return layoutStruct;
}